

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControlLabel::ControlLabel(ControlLabel *this,QWidget *parent)

{
  long in_FS_OFFSET;
  QSizeF local_30;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007cff78;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__ControlLabel_007d0128;
  QPixmap::QPixmap(&this->label);
  this->isPressed = false;
  QWidget::setFocusPolicy(&this->super_QWidget,NoFocus);
  updateWindowIcon(this);
  local_30.wd = (qreal)QPixmap::deviceIndependentSize();
  local_20 = QSizeF::toSize(&local_30);
  QWidget::setFixedSize(&this->super_QWidget,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlLabel::ControlLabel(QWidget *parent)
    : QWidget(parent), isPressed(false)
{
    setFocusPolicy(Qt::NoFocus);
    updateWindowIcon();
    setFixedSize(label.deviceIndependentSize().toSize());
}